

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDependenceAnalysisImpl.h
# Opt level: O2

void __thiscall
dg::dda::DataDependenceAnalysisImpl::~DataDependenceAnalysisImpl(DataDependenceAnalysisImpl *this)

{
  this->_vptr_DataDependenceAnalysisImpl = (_func_int **)&PTR__DataDependenceAnalysisImpl_0012ed50;
  DataDependenceAnalysisOptions::~DataDependenceAnalysisOptions(&this->options);
  ReadWriteGraph::~ReadWriteGraph(&this->graph);
  return;
}

Assistant:

virtual ~DataDependenceAnalysisImpl() = default;